

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCase *testCase)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  IStreamingReporter *pIVar7;
  undefined8 _totals;
  int iVar8;
  SectionTracker *pSVar9;
  IMutableContext *pIVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  TestCaseStats local_350;
  undefined1 local_1c0 [8];
  TestCaseInfo testInfo;
  undefined1 local_70 [8];
  string redirectedCout;
  string redirectedCerr;
  
  sVar1 = (this->m_totals).assertions.passed;
  sVar2 = (this->m_totals).assertions.failed;
  sVar3 = (this->m_totals).assertions.failedButOk;
  sVar4 = (this->m_totals).testCases.passed;
  sVar5 = (this->m_totals).testCases.failed;
  sVar6 = (this->m_totals).testCases.failedButOk;
  local_70 = (undefined1  [8])&redirectedCout._M_string_length;
  redirectedCout._M_dataplus._M_p = (pointer)0x0;
  redirectedCout._M_string_length._0_1_ = 0;
  redirectedCout.field_2._8_8_ = &redirectedCerr._M_string_length;
  redirectedCerr._M_dataplus._M_p = (pointer)0x0;
  redirectedCerr._M_string_length._0_1_ = 0;
  testInfo._264_8_ = __return_storage_ptr__;
  TestCaseInfo::TestCaseInfo((TestCaseInfo *)local_1c0,&testCase->super_TestCaseInfo);
  pIVar7 = (this->m_reporter).m_p;
  (*(pIVar7->super_IShared).super_NonCopyable._vptr_NonCopyable[8])(pIVar7,local_1c0);
  this->m_activeTestCase = testCase;
  do {
    TestCaseTracking::TrackerContext::startRun(&this->m_trackerContext);
    do {
      (this->m_trackerContext).m_currentTracker = (this->m_trackerContext).m_rootTracker.m_p;
      (this->m_trackerContext).m_runState = Executing;
      pSVar9 = TestCaseTracking::SectionTracker::acquire
                         (&this->m_trackerContext,(string *)local_1c0);
      this->m_testCaseTracker = (ITracker *)pSVar9;
      runCurrentTest(this,(string *)local_70,(string *)((long)&redirectedCout.field_2 + 8));
      iVar8 = (*(this->m_testCaseTracker->super_SharedImpl<Catch::IShared>).super_IShared.
                super_NonCopyable._vptr_NonCopyable[6])();
      if ((char)iVar8 != '\0') break;
      iVar8 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xb])(this);
    } while ((char)iVar8 == '\0');
    pIVar10 = getCurrentMutableContext();
    iVar8 = (*(pIVar10->super_IContext)._vptr_IContext[5])(pIVar10);
    if ((char)iVar8 == '\0') break;
    iVar8 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xb])(this);
  } while ((char)iVar8 == '\0');
  _totals = testInfo._264_8_;
  lVar11 = (this->m_totals).assertions.failedButOk - sVar3;
  lVar12 = (this->m_totals).assertions.failed - sVar2;
  *(size_t *)testInfo._264_8_ = (this->m_totals).assertions.passed - sVar1;
  *(long *)(testInfo._264_8_ + 8) = lVar12;
  *(long *)(testInfo._264_8_ + 0x10) = lVar11;
  sVar1 = (this->m_totals).testCases.passed;
  sVar2 = (this->m_totals).testCases.failed;
  sVar3 = (this->m_totals).testCases.failedButOk;
  lVar13 = 0x20;
  if (lVar12 == 0) {
    lVar13 = (ulong)(lVar11 != 0) * 0x10 + 0x18;
  }
  *(size_t *)(testInfo._264_8_ + 0x18) = sVar1 - sVar4;
  *(size_t *)(testInfo._264_8_ + 0x20) = sVar2 - sVar5;
  *(size_t *)(testInfo._264_8_ + 0x28) = sVar3 - sVar6;
  *(long *)(testInfo._264_8_ + lVar13) = *(long *)(testInfo._264_8_ + lVar13) + 1;
  lVar13 = *(long *)(testInfo._264_8_ + 0x18);
  lVar11 = *(long *)(testInfo._264_8_ + 0x20);
  if ((lVar13 != 0 & (byte)testInfo.lineInfo.line >> 2) == 1) {
    *(long *)(testInfo._264_8_ + 8) = lVar12 + 1;
    lVar13 = lVar13 + -1;
    *(long *)(testInfo._264_8_ + 0x18) = lVar13;
    lVar11 = lVar11 + 1;
    *(long *)(testInfo._264_8_ + 0x20) = lVar11;
  }
  (this->m_totals).testCases.passed = sVar1 + lVar13;
  (this->m_totals).testCases.failed = sVar2 + lVar11;
  (this->m_totals).testCases.failedButOk = sVar3 + *(long *)(testInfo._264_8_ + 0x28);
  pIVar7 = (this->m_reporter).m_p;
  iVar8 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xb])(this);
  TestCaseStats::TestCaseStats
            (&local_350,(TestCaseInfo *)local_1c0,(Totals *)_totals,(string *)local_70,
             (string *)((long)&redirectedCout.field_2 + 8),SUB41(iVar8,0));
  (*(pIVar7->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar7,&local_350);
  TestCaseStats::~TestCaseStats(&local_350);
  this->m_activeTestCase = (TestCase *)0x0;
  this->m_testCaseTracker = (ITracker *)0x0;
  TestCaseInfo::~TestCaseInfo((TestCaseInfo *)local_1c0);
  if ((size_type *)redirectedCout.field_2._8_8_ != &redirectedCerr._M_string_length) {
    operator_delete((void *)redirectedCout.field_2._8_8_,
                    CONCAT71(redirectedCerr._M_string_length._1_7_,
                             (undefined1)redirectedCerr._M_string_length) + 1);
  }
  if (local_70 != (undefined1  [8])&redirectedCout._M_string_length) {
    operator_delete((void *)local_70,
                    CONCAT71(redirectedCout._M_string_length._1_7_,
                             (undefined1)redirectedCout._M_string_length) + 1);
  }
  return (Totals *)_totals;
}

Assistant:

Totals runTest( TestCase const& testCase ) {
            Totals prevTotals = m_totals;

            std::string redirectedCout;
            std::string redirectedCerr;

            TestCaseInfo testInfo = testCase.getTestCaseInfo();

            m_reporter->testCaseStarting( testInfo );

            m_activeTestCase = &testCase;

            do {
                m_trackerContext.startRun();
                do {
                    m_trackerContext.startCycle();
                    m_testCaseTracker = &SectionTracker::acquire( m_trackerContext, testInfo.name );
                    runCurrentTest( redirectedCout, redirectedCerr );
                }
                while( !m_testCaseTracker->isSuccessfullyCompleted() && !aborting() );
            }
            // !TBD: deprecated - this will be replaced by indexed trackers
            while( getCurrentContext().advanceGeneratorsForCurrentTest() && !aborting() );

            Totals deltaTotals = m_totals.delta( prevTotals );
            if( testInfo.expectedToFail() && deltaTotals.testCases.passed > 0 ) {
                deltaTotals.assertions.failed++;
                deltaTotals.testCases.passed--;
                deltaTotals.testCases.failed++;
            }
            m_totals.testCases += deltaTotals.testCases;
            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        redirectedCout,
                                                        redirectedCerr,
                                                        aborting() ) );

            m_activeTestCase = CATCH_NULL;
            m_testCaseTracker = CATCH_NULL;

            return deltaTotals;
        }